

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O3

void diy::Serialization<diy::DynamicPoint<int,_4UL>_>::save(BinaryBuffer *bb,Point *p)

{
  pointer piVar1;
  size_t s;
  long local_20;
  
  local_20 = (long)(p->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_end -
             (long)(p->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_begin >> 2;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_20,8);
  if (local_20 != 0) {
    piVar1 = (p->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_begin;
    (*bb->_vptr_BinaryBuffer[2])
              (bb,piVar1,
               (long)(p->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_end -
               (long)piVar1);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Point& p)
    {
      size_t s = p.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &p[0], p.size());
    }